

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O2

void __thiscall
Memory::
WriteBarrierPtr<JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>_>
::WriteBarrierSet(WriteBarrierPtr<JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>_>
                  *this,SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>_>
                        *ptr)

{
  Recycler::WBSetBit((char *)this);
  this->ptr = ptr;
  RecyclerWriteBarrierManager::WriteBarrier(this);
  return;
}

Assistant:

void WriteBarrierSet(T * ptr)
    {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
        // set the verification bits before updating the reference so it's ready to verify while background marking hit the reference
        Recycler::WBSetBit((char*)this);
#endif

        NoWriteBarrierSet(ptr);

#ifdef RECYCLER_WRITE_BARRIER
        // set the barrier bit after updating the reference to prevent a race issue that background thread is resetting all the dirty pages
        RecyclerWriteBarrierManager::WriteBarrier(this);
#endif
    }